

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarySearch.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *retVector;
  ostream *poVar3;
  char *pcVar4;
  allocator local_69;
  string local_68;
  string inFileName;
  
  std::__cxx11::string::string((string *)&inFileName,"",&local_69);
  while( true ) {
    bVar1 = std::operator==(&inFileName,"");
    if (!bVar1) break;
    std::operator<<((ostream *)&std::cout,
                    "Please type the filename that you would like to search for 0 in: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&inFileName);
  }
  retVector = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_68,(string *)&inFileName);
  ReadFile(&local_68,retVector);
  std::__cxx11::string::~string((string *)&local_68);
  if ((retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    clock();
    iVar2 = binarySearch(retVector,0,
                         (int)((ulong)((long)(retVector->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(retVector->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start) >> 2),0);
    clock();
    poVar3 = std::operator<<((ostream *)&std::cout,"Total time was ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," processor cycles.");
    std::endl<char,std::char_traits<char>>(poVar3);
    if (iVar2 == -1) {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      pcVar4 = "No 0 found!";
    }
    else {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar3 = std::operator<<(poVar3,"Found 0 at position: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      pcVar4 = " (0-indexed)";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&inFileName);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"File does not exist!");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int main()
{
    std::string inFileName = "";

    while(inFileName == "")
    {
        std::cout << "Please type the filename that you would like to search for 0 in: ";
        getline(std::cin, inFileName);
    }

    std::vector<int> *searchInts = new std::vector<int>;
    ReadFile(inFileName, searchInts);
    if(searchInts->size() == 0)
    {
        std::cout << "File does not exist!" << std::endl;
        exit(1);
    }
    std::clock_t t;
    t = clock();
    int position = binarySearch(searchInts, 0, searchInts->size(), 0);
    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;

    if(position == -1)
    {
        std::cout << std::endl << "No 0 found!" << std::endl;
    }
    else
    {
        std::cout << std::endl << "Found 0 at position: " << position << " (0-indexed)" << std::endl;
    }

    return 0;
}